

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O1

EPSG * EPSG_new(UINT32 c,UINT32 r)

{
  uint32_t uVar1;
  EPSG *psg;
  uint8_t *puVar2;
  long lVar3;
  
  psg = (EPSG *)calloc(1,0xc0);
  if (psg == (EPSG *)0x0) {
    psg = (EPSG *)0x0;
  }
  else {
    psg->voltbl = voltbl[0];
    uVar1 = 0xac44;
    if (r != 0) {
      uVar1 = r;
    }
    psg->clk = c;
    psg->rate = uVar1;
    psg->chp_flags = '\0';
    psg->quality = 0;
    internal_refresh(psg);
    puVar2 = psg->stereo_mask;
    lVar3 = 0x9c;
    do {
      *puVar2 = '\x03';
      Panning_Centre((INT32 *)(psg->reg + lVar3 + -0x10));
      puVar2 = puVar2 + 1;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0xb4);
    psg->mask = 0;
  }
  return psg;
}

Assistant:

EPSG *
EPSG_new (UINT32 c, UINT32 r)
{
  EPSG *psg;
  uint8_t i;

  psg = (EPSG *) calloc (1, sizeof (EPSG));
  if (psg == NULL)
    return NULL;

  EPSG_setVolumeMode (psg, EMU2149_VOL_DEFAULT);
  psg->clk = c;
  psg->rate = r ? r : 44100;
  psg->chp_flags = 0x00;
  EPSG_set_quality (psg, 0);

  for (i = 0; i < 3; i++)
  {
    psg->stereo_mask[i] = 0x03;
    Panning_Centre(psg->pan[i]);
  }

  EPSG_setMask(psg, 0x00);

  return psg;
}